

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiID id_00;
  ImGuiID IVar4;
  ImGuiWindow *this;
  value_type *pvVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float fVar11;
  ImRect IVar12;
  bool local_14f;
  bool local_14e;
  byte local_14d;
  bool local_141;
  ImGuiWindowFlags flags;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *next_window;
  bool moving_within_opened_triangle;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  float local_94;
  float local_90;
  float extra_w;
  float w_1;
  ImVec2 local_84;
  float local_7c;
  ImVec2 IStack_78;
  float w;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 pos;
  ImVec2 popup_pos;
  bool menuset_is_open;
  bool menu_is_open;
  bool pressed;
  ImGuiWindow *backed_focused_window;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar10 = CalcTextSize(label,(char *)0x0,true,-1.0);
    pIVar2 = pIVar3->FocusedWindow;
    popup_pos.y._2_1_ = IsPopupOpen(id_00);
    bVar6 = false;
    if (((this->Flags & 0x2000000U) == 0) &&
       (bVar6 = false, (pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      pvVar5 = ImVector<ImGuiPopupRef>::operator[]
                         (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size);
      IVar1 = pvVar5->ParentMenuSet;
      IVar4 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
      bVar6 = IVar1 == IVar4;
    }
    if (bVar6) {
      pIVar3->FocusedWindow = this;
    }
    ImVec2::ImVec2(&pos);
    local_68 = (this->DC).CursorPos;
    backed_focused_window._4_4_ = IVar10.x;
    if ((this->DC).LayoutType == 1) {
      fVar11 = local_68.x - (this->WindowPadding).x;
      fVar8 = local_68.y - (pIVar3->Style).FramePadding.y;
      fVar9 = ImGuiWindow::MenuBarHeight(this);
      ImVec2::ImVec2(&local_70,fVar11,fVar8 + fVar9);
      pos = local_70;
      (this->DC).CursorPos.x =
           (this->DC).CursorPos.x + (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5);
      IStack_78 = operator*(&(pIVar3->Style).ItemSpacing,2.0);
      PushStyleVar(7,&stack0xffffffffffffff88);
      local_7c = backed_focused_window._4_4_;
      uVar7 = 0;
      if (((enabled ^ 0xffU) & 1) != 0) {
        uVar7 = 0x20;
      }
      ImVec2::ImVec2(&local_84,backed_focused_window._4_4_,0.0);
      popup_pos.y._3_1_ = Selectable(label,popup_pos.y._2_1_,uVar7 | 9,&local_84);
      PopStyleVar(1);
      SameLine(0.0,-1.0);
      (this->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&extra_w,local_68.x,local_68.y - (pIVar3->Style).WindowPadding.y);
      pos = _extra_w;
      local_90 = ImGuiSimpleColumns::DeclColumns
                           (&this->MenuColumns,backed_focused_window._4_4_,0.0,
                            (float)(int)(pIVar3->FontSize * 1.2));
      local_9c = GetContentRegionAvail();
      local_94 = ImMax(0.0,local_9c.x - local_90);
      uVar7 = 0;
      if (((enabled ^ 0xffU) & 1) != 0) {
        uVar7 = 0x20;
      }
      ImVec2::ImVec2(&local_a4,local_90,0.0);
      popup_pos.y._3_1_ = Selectable(label,popup_pos.y._2_1_,uVar7 | 0x49,&local_a4);
      if (!enabled) {
        PushStyleColor(0,(pIVar3->Style).Colors + 1);
      }
      ImVec2::ImVec2((ImVec2 *)((long)&next_window + 4),
                     pIVar3->FontSize * 0.2 + (this->MenuColumns).Pos[2] + local_94,0.0);
      local_ac = operator+(&local_68,(ImVec2 *)((long)&next_window + 4));
      RenderCollapseTriangle(local_ac,false,1.0,false);
      if (!enabled) {
        PopStyleColor(1);
      }
    }
    local_141 = false;
    if (enabled) {
      local_141 = IsHovered(&(this->DC).LastItemRect,id_00,false);
    }
    next_window._3_1_ = local_141;
    if (bVar6) {
      pIVar3->FocusedWindow = pIVar2;
    }
    next_window._2_1_ = false;
    next_window._1_1_ = 0;
    if ((this->Flags & 0xa000000U) == 0) {
      if (((popup_pos.y._2_1_) && (popup_pos.y._3_1_ != false)) && (bVar6)) {
        next_window._1_1_ = 1;
        popup_pos.y._2_1_ = false;
        next_window._2_1_ = false;
      }
      else if ((popup_pos.y._3_1_ != false) ||
              (((local_141 != false && (bVar6)) && (!popup_pos.y._2_1_)))) {
        next_window._2_1_ = true;
      }
    }
    else {
      next_window._0_1_ = 0;
      if (((pIVar3->HoveredWindow == this) &&
          ((pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) &&
         (pvVar5 = ImVector<ImGuiPopupRef>::operator[]
                             (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size),
         pvVar5->ParentWindow == this)) {
        pvVar5 = ImVector<ImGuiPopupRef>::operator[]
                           (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size);
        pIVar2 = pvVar5->Window;
        if (pIVar2 != (ImGuiWindow *)0x0) {
          IVar12 = ImGuiWindow::Rect(pIVar2);
          ta = IVar12.Min;
          tb = operator-(&(pIVar3->IO).MousePos,&(pIVar3->IO).MouseDelta);
          if ((pIVar2->Pos).x <= (this->Pos).x) {
            tc = ImRect::GetTR((ImRect *)&ta);
          }
          else {
            tc = ImRect::GetTL((ImRect *)&ta);
          }
          if ((pIVar2->Pos).x <= (this->Pos).x) {
            _flags = ImRect::GetBR((ImRect *)&ta);
          }
          else {
            _flags = ImRect::GetBL((ImRect *)&ta);
          }
          fVar9 = ImClamp(ABS(tb.x - tc.x) * 0.3,5.0,30.0);
          uVar7 = -(uint)((this->Pos).x < (pIVar2->Pos).x);
          fVar8 = tb.y;
          tb.x = (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) + tb.x;
          fVar11 = ImMax((tc.y - fVar9) - tb.y,-100.0);
          tc.y = fVar8 + fVar11;
          fVar8 = tb.y;
          fVar9 = ImMin((extra + fVar9) - tb.y,100.0);
          extra = fVar8 + fVar9;
          next_window._0_1_ = ImIsPointInTriangle(&(pIVar3->IO).MousePos,&tb,&tc,(ImVec2 *)&flags);
        }
      }
      local_14d = 0;
      if ((((popup_pos.y._2_1_) && (local_14d = 0, (next_window._3_1_ & 1) == 0)) &&
          (local_14d = 0, pIVar3->HoveredWindow == this)) &&
         ((local_14d = 0, pIVar3->HoveredIdPreviousFrame != 0 &&
          (local_14d = 0, pIVar3->HoveredIdPreviousFrame != id_00)))) {
        local_14d = (byte)next_window ^ 0xff;
      }
      next_window._1_1_ = local_14d & 1;
      if (((popup_pos.y._2_1_) || ((next_window._3_1_ & 1) == 0)) ||
         (local_14e = true, ((byte)next_window & 1) != 0)) {
        local_14f = false;
        if ((!popup_pos.y._2_1_) && (local_14f = false, (next_window._3_1_ & 1) != 0)) {
          local_14f = popup_pos.y._3_1_;
        }
        local_14e = local_14f;
      }
      next_window._2_1_ = local_14e;
    }
    if (!enabled) {
      next_window._1_1_ = 1;
    }
    if ((next_window._1_1_ != 0) && (bVar6 = IsPopupOpen(id_00), bVar6)) {
      ClosePopupToLevel((GImGui->CurrentPopupStack).Size);
    }
    if (((popup_pos.y._2_1_ == false) && ((next_window._2_1_ & 1) != 0)) &&
       ((pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      OpenPopup(label);
      label_local._7_1_ = false;
    }
    else {
      popup_pos.y._2_1_ = popup_pos.y._2_1_ != false || (next_window._2_1_ & 1) != 0;
      if ((next_window._2_1_ & 1) != 0) {
        OpenPopup(label);
      }
      if (popup_pos.y._2_1_) {
        SetNextWindowPos(&pos,1);
        uVar7 = 0x8000000;
        if ((this->Flags & 0xa000000U) != 0) {
          uVar7 = 0x8100000;
        }
        popup_pos.y._2_1_ = BeginPopupEx(label,uVar7 | 0x80);
      }
      label_local._7_1_ = popup_pos.y._2_1_;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImGuiWindow* backed_focused_window = g.FocusedWindow;

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentMenuSet == window->GetID("##menus"));
    if (menuset_is_open)
        g.FocusedWindow = window;

    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        popup_pos = ImVec2(pos.x - window->WindowPadding.x, pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        SameLine();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
    }
    else
    {
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_Menu | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderCollapseTriangle(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.20f, 0.0f), false);
        if (!enabled) PopStyleColor();
    }

    bool hovered = enabled && IsHovered(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.FocusedWindow = backed_focused_window;

    bool want_open = false, want_close = false;
    if (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentWindow == window)
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.CurrentPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(fabsf(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImIsPointInTriangle(g.IO.MousePos, ta, tb, tc);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? 0x80008000 : 0x80000080); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);
    }
    else if (menu_is_open && pressed && menuset_is_open) // menu-bar: click open menu to close
    {
        want_close = true;
        want_open = menu_is_open = false;
    }
    else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // menu-bar: first click to open, then hover to open others
        want_open = true;
    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(GImGui->CurrentPopupStack.Size);

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.CurrentPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiSetCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_ShowBorders | ((window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu)) ? ImGuiWindowFlags_ChildMenu|ImGuiWindowFlags_ChildWindow : ImGuiWindowFlags_ChildMenu);
        menu_is_open = BeginPopupEx(label, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}